

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O1

void __thiscall
crnlib::dxt_image::set_block_pixels
          (dxt_image *this,uint block_x,uint block_y,color_quad_u8 *pPixels,pack_params *p)

{
  set_block_pixels_context context;
  set_block_pixels_context local_f30;
  
  dxt1_endpoint_optimizer::dxt1_endpoint_optimizer(&local_f30.m_dxt1_optimizer);
  dxt5_endpoint_optimizer::dxt5_endpoint_optimizer(&local_f30.m_dxt5_optimizer);
  local_f30.m_etc1_optimizer.m_optimizer.m_sorted_luma[1].m_p = (uint *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_sorted_luma[1].m_size = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_sorted_luma[1].m_capacity = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_sorted_luma[0].m_p = (uint *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_sorted_luma[0].m_size = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_sorted_luma[0].m_capacity = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_luma.m_p = (unsigned_short *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_luma.m_size = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_luma.m_capacity = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_best_solution.m_selectors.m_p = (uchar *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_best_solution.m_selectors.m_size = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_best_solution.m_selectors.m_capacity = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_selectors.m_p = (uchar *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_selectors.m_size = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_selectors.m_capacity = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_best_selectors.m_p = (uchar *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_best_selectors.m_size._0_1_ = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_best_selectors._9_7_ = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_best_solution.m_coords.m_unscaled_color.field_0.field_0.r
       = '\0';
  local_f30.m_etc1_optimizer.m_optimizer.m_best_solution.m_coords._1_8_ = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_best_solution.m_error = 0xffffffffffffffff;
  local_f30.m_etc1_optimizer.m_optimizer.m_best_solution.m_valid = false;
  local_f30.m_etc1_optimizer.m_optimizer.m_trial_solution.m_coords.m_color4 = false;
  local_f30.m_etc1_optimizer.m_optimizer.m_trial_solution.m_coords.m_unscaled_color.field_0 =
       (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_trial_solution.m_coords.m_inten_table = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_trial_solution.m_selectors.m_p = (uchar *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_trial_solution.m_selectors.m_size = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_trial_solution.m_selectors.m_capacity = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_trial_solution.m_error = 0xffffffffffffffff;
  local_f30.m_etc1_optimizer.m_optimizer.m_trial_solution.m_valid = false;
  local_f30.m_etc1_optimizer.m_optimizer.m_temp_selectors.m_p = (uchar *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_temp_selectors.m_size = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_temp_selectors.m_capacity = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_pParams = (params *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_pResult = (results *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_pSorted_luma_indices = (uint32 *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_pSorted_luma = (uint32 *)0x0;
  set_block_pixels(this,block_x,block_y,pPixels,p,&local_f30);
  etc1_optimizer::~etc1_optimizer(&local_f30.m_etc1_optimizer.m_optimizer);
  dxt5_endpoint_optimizer::~dxt5_endpoint_optimizer(&local_f30.m_dxt5_optimizer);
  dxt1_endpoint_optimizer::~dxt1_endpoint_optimizer(&local_f30.m_dxt1_optimizer);
  return;
}

Assistant:

void dxt_image::set_block_pixels(uint block_x, uint block_y, const color_quad_u8* pPixels, const pack_params& p) {
  set_block_pixels_context context;
  set_block_pixels(block_x, block_y, pPixels, p, context);
}